

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O1

void lace_steal_external(WorkerP *self,Task *dq_head)

{
  ExtTask *pEVar1;
  
  pEVar1 = external_task;
  LOCK();
  external_task = (ExtTask *)0x0;
  UNLOCK();
  if (pEVar1 != (ExtTask *)0x0) {
    LOCK();
    pEVar1->task->thief = self->_public;
    UNLOCK();
    pEVar1->task->thief = self->_public;
    (*pEVar1->task->f)(self,dq_head,pEVar1->task);
    pEVar1->task->thief = (_Worker *)0x2;
    sem_post((sem_t *)&pEVar1->sem);
    return;
  }
  return;
}

Assistant:

static inline void
lace_steal_external(WorkerP *self, Task *dq_head) 
{
    ExtTask *stolen_task = atomic_exchange(&external_task, NULL);
    if (stolen_task != 0) {
        // execute task
        stolen_task->task->thief = self->_public;
        atomic_store_explicit(&stolen_task->task->thief, self->_public, memory_order_relaxed);
        lace_time_event(self, 1);
        // atomic_thread_fence(memory_order_relaxed);
        stolen_task->task->f(self, dq_head, stolen_task->task);
        // atomic_thread_fence(memory_order_relaxed);
        lace_time_event(self, 2);
        // atomic_thread_fence(memory_order_relaxed);
        atomic_store_explicit(&stolen_task->task->thief, THIEF_COMPLETED, memory_order_relaxed);
        // atomic_thread_fence(memory_order_relaxed);
        sem_post(&stolen_task->sem);
        lace_time_event(self, 8);
    }
}